

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O2

DynamicObject * __thiscall
Js::DebugManager::GetConsoleScope(DebugManager *this,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DynamicObject *pDVar4;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                ,0x87,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pDVar4 = (this->pConsoleScope).ptr;
  if (pDVar4 == (DynamicObject *)0x0) {
    pDVar4 = JavascriptLibrary::CreateConsoleScopeActivationObject
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    Memory::RecyclerRootPtr<Js::DynamicObject>::Root
              (&this->pConsoleScope,pDVar4,this->pThreadContext->recycler);
    pDVar4 = (this->pConsoleScope).ptr;
  }
  pDVar4 = (DynamicObject *)CrossSite::MarshalVar(scriptContext,pDVar4,false);
  return pDVar4;
}

Assistant:

DynamicObject* DebugManager::GetConsoleScope(ScriptContext* scriptContext)
    {
        Assert(scriptContext);

        if (!this->pConsoleScope)
        {
            this->pConsoleScope.Root(scriptContext->GetLibrary()->CreateConsoleScopeActivationObject(), this->pThreadContext->GetRecycler());
        }

        return (DynamicObject*)CrossSite::MarshalVar(scriptContext, (Var)this->pConsoleScope);
    }